

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindowStackData *pIVar3;
  ImGuiColorMod *pIVar4;
  char *pcVar5;
  undefined8 in_RSI;
  code *in_RDI;
  ImGuiStackSizes *stack_sizes;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *in_stack_ffffffffffffffc0;
  undefined3 uVar6;
  uint in_stack_ffffffffffffffd4;
  
  pIVar2 = GImGui;
  while( true ) {
    in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 & 0xffffff;
    if (pIVar2->CurrentTable != (ImGuiTable *)0x0) {
      uVar6 = CONCAT12(1,(short)in_stack_ffffffffffffffd4);
      if (pIVar2->CurrentTable->OuterWindow != pIVar2->CurrentWindow) {
        uVar6 = CONCAT12(pIVar2->CurrentTable->InnerWindow == pIVar2->CurrentWindow,
                         (short)in_stack_ffffffffffffffd4);
      }
      in_stack_ffffffffffffffd4 = CONCAT13((char)((uint3)uVar6 >> 0x10),uVar6);
    }
    if ((char)(in_stack_ffffffffffffffd4 >> 0x18) == '\0') break;
    if (in_RDI != (code *)0x0) {
      (*in_RDI)(in_RSI,"Recovered from missing EndTable() in \'%s\'",
                pIVar2->CurrentTable->OuterWindow->Name);
    }
    EndTable();
  }
  pIVar1 = pIVar2->CurrentWindow;
  pIVar3 = ImVector<ImGuiWindowStackData>::back(&pIVar2->CurrentWindowStack);
  while (pIVar2->CurrentTabBar != (ImGuiTabBar *)0x0) {
    if (in_RDI != (code *)0x0) {
      (*in_RDI)(in_RSI,"Recovered from missing EndTabBar() in \'%s\'",pIVar1->Name);
    }
    EndTabBar();
  }
  while (0 < (pIVar1->DC).TreeDepth) {
    if (in_RDI != (code *)0x0) {
      (*in_RDI)(in_RSI,"Recovered from missing TreePop() in \'%s\'",pIVar1->Name);
    }
    TreePop();
  }
  while ((int)(pIVar3->StackSizesOnBegin).SizeOfGroupStack < (pIVar2->GroupStack).Size) {
    if (in_RDI != (code *)0x0) {
      (*in_RDI)(in_RSI,"Recovered from missing EndGroup() in \'%s\'",pIVar1->Name);
    }
    EndGroup();
  }
  while (1 < (pIVar1->IDStack).Size) {
    if (in_RDI != (code *)0x0) {
      (*in_RDI)(in_RSI,"Recovered from missing PopID() in \'%s\'",pIVar1->Name);
    }
    PopID();
  }
  while ((pIVar3->StackSizesOnBegin).SizeOfDisabledStack < pIVar2->DisabledStackSize) {
    if (in_RDI != (code *)0x0) {
      (*in_RDI)(in_RSI,"Recovered from missing EndDisabled() in \'%s\'",pIVar1->Name);
    }
    EndDisabled();
  }
  while ((int)(pIVar3->StackSizesOnBegin).SizeOfColorStack < (pIVar2->ColorStack).Size) {
    if (in_RDI != (code *)0x0) {
      in_stack_ffffffffffffffc0 = pIVar1->Name;
      pIVar4 = ImVector<ImGuiColorMod>::back(&pIVar2->ColorStack);
      pcVar5 = GetStyleColorName(pIVar4->Col);
      (*in_RDI)(in_RSI,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s",
                in_stack_ffffffffffffffc0,pcVar5);
    }
    PopStyleColor((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  }
  while ((int)(pIVar3->StackSizesOnBegin).SizeOfItemFlagsStack < (pIVar2->ItemFlagsStack).Size) {
    if (in_RDI != (code *)0x0) {
      (*in_RDI)(in_RSI,"Recovered from missing PopItemFlag() in \'%s\'",pIVar1->Name);
    }
    PopItemFlag();
  }
  while ((int)(pIVar3->StackSizesOnBegin).SizeOfStyleVarStack < (pIVar2->StyleVarStack).Size) {
    if (in_RDI != (code *)0x0) {
      (*in_RDI)(in_RSI,"Recovered from missing PopStyleVar() in \'%s\'",pIVar1->Name);
    }
    PopStyleVar(in_stack_ffffffffffffffd4);
  }
  while ((pIVar3->StackSizesOnBegin).SizeOfFocusScopeStack + 1 < (pIVar2->FocusScopeStack).Size) {
    if (in_RDI != (code *)0x0) {
      (*in_RDI)(in_RSI,"Recovered from missing PopFocusScope() in \'%s\'",pIVar1->Name);
    }
    PopFocusScope();
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    ImGuiContext& g = *GImGui;
    while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
        EndTable();
    }

    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackSizes* stack_sizes = &g.CurrentWindowStack.back().StackSizesOnBegin;
    IM_ASSERT(window != NULL);
    while (g.CurrentTabBar != NULL) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
        EndTabBar();
    }
    while (window->DC.TreeDepth > 0)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
        TreePop();
    }
    while (g.GroupStack.Size > stack_sizes->SizeOfGroupStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
        EndGroup();
    }
    while (window->IDStack.Size > 1)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
        PopID();
    }
    while (g.DisabledStackSize > stack_sizes->SizeOfDisabledStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndDisabled() in '%s'", window->Name);
        EndDisabled();
    }
    while (g.ColorStack.Size > stack_sizes->SizeOfColorStack)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
        PopStyleColor();
    }
    while (g.ItemFlagsStack.Size > stack_sizes->SizeOfItemFlagsStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopItemFlag() in '%s'", window->Name);
        PopItemFlag();
    }
    while (g.StyleVarStack.Size > stack_sizes->SizeOfStyleVarStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
        PopStyleVar();
    }
    while (g.FocusScopeStack.Size > stack_sizes->SizeOfFocusScopeStack + 1) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
        PopFocusScope();
    }
}